

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase414::run(TestCase414 *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar2;
  long lVar3;
  StringPtr text;
  StringPtr text_00;
  Own<kj::File,_std::nullptr_t> dest;
  Array<char> local_a8;
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool local_68;
  bool local_60;
  Own<kj::File,_std::nullptr_t> source;
  String bigString;
  TestClock clock;
  DebugExpression<kj::StringPtr> local_20;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_005887b0;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryFile((kj *)&source,&clock.super_Clock);
  text.content.size_ = 10;
  text.content.ptr = "foobarbaz";
  File::writeAll(source.ptr,text);
  newInMemoryFile((kj *)&dest,&clock.super_Clock);
  text_00.content.size_ = 9;
  text_00.content.ptr = "quxcorge";
  File::writeAll(dest.ptr,text_00);
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  iVar1 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x3,(EVP_PKEY_CTX *)source.ptr);
  _kjCondition.left = CONCAT44(extraout_var,iVar1);
  _kjCondition.right = 3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 3;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"dest->File::copy(3, *source, 6, kj::maxValue) == 3\", _kjCondition"
               ,(char (*) [68])"failed: expected dest->File::copy(3, *source, 6, kj::maxValue) == 3"
               ,&_kjCondition);
  }
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  ReadableFile::readAllText((String *)&local_a8,&(dest.ptr)->super_ReadableFile);
  bigString.content.ptr = local_a8.ptr;
  bigString.content.size_ = local_a8.size_;
  bigString.content.disposer = local_a8.disposer;
  local_a8.ptr = (char *)0x0;
  local_a8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)&_kjCondition,
             (DebugExpression<kj::String> *)&bigString,(char (*) [9])"quxbazge");
  Array<char>::~Array(&bigString.content);
  Array<char>::~Array(&local_a8);
  if ((local_60 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1aa,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"quxbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"quxbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  iVar1 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)source.ptr);
  _kjCondition.left = CONCAT44(extraout_var_00,iVar1);
  _kjCondition.right = 4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ac,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 3, 4) == 4\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(0, *source, 3, 4) == 4",
               &_kjCondition);
  }
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  ReadableFile::readAllText((String *)&local_a8,&(dest.ptr)->super_ReadableFile);
  bigString.content.ptr = local_a8.ptr;
  bigString.content.size_ = local_a8.size_;
  bigString.content.disposer = local_a8.disposer;
  local_a8.ptr = (char *)0x0;
  local_a8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[9]> *)&_kjCondition,
             (DebugExpression<kj::String> *)&bigString,(char (*) [9])"barbazge");
  Array<char>::~Array(&bigString.content);
  Array<char>::~Array(&local_a8);
  if ((local_60 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ae,ERROR,
               "\"failed: expected \" \"dest->readAllText() == \\\"barbazge\\\"\", _kjCondition",
               (char (*) [51])"failed: expected dest->readAllText() == \"barbazge\"",
               (DebugComparison<kj::String,_const_char_(&)[9]> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  iVar1 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)source.ptr);
  _kjCondition.left = CONCAT44(extraout_var_01,iVar1);
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b0,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 128, kj::maxValue) == 0\", _kjCondition"
               ,(char (*) [70])
                "failed: expected dest->File::copy(0, *source, 128, kj::maxValue) == 0",
               &_kjCondition);
  }
  TestClock::expectUnchanged(&clock,(FsNode *)dest.ptr);
  pcVar2 = (char *)0x3;
  iVar1 = File::copy(dest.ptr,(EVP_PKEY_CTX *)&DAT_00000004,(EVP_PKEY_CTX *)source.ptr);
  _kjCondition.left = CONCAT44(extraout_var_02,iVar1);
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    pcVar2 = "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition";
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b3,ERROR,
               "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\", _kjCondition",
               (char (*) [57])"failed: expected dest->File::copy(4, *source, 3, 0) == 0",
               &_kjCondition);
  }
  TestClock::expectUnchanged(&clock,(FsNode *)dest.ptr);
  _kjCondition.left = (long)"POST / HTTP/1.1\r\nContent-Length: 6\r\n\r\nfoobar" + 0x26;
  _kjCondition.right = 10000;
  _kjCondition._12_4_ = 0;
  strArray<kj::Repeat<char_const*>>
            (&bigString,(kj *)&_kjCondition,(Repeat<const_char_*> *)0x3fdd82,pcVar2);
  lVar3 = 0;
  if (bigString.content.size_ != 0) {
    lVar3 = bigString.content.size_ - 1;
  }
  (*((source.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xb])(source.ptr,lVar3 + 1000);
  pcVar2 = (char *)bigString.content.size_;
  if (bigString.content.size_ != 0) {
    pcVar2 = bigString.content.ptr;
  }
  lVar3 = 0;
  if (bigString.content.size_ != 0) {
    lVar3 = bigString.content.size_ - 1;
  }
  (*((source.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[9])(source.ptr,0x7b,pcVar2,lVar3);
  File::copy(dest.ptr,(EVP_PKEY_CTX *)0x141,(EVP_PKEY_CTX *)source.ptr);
  ReadableFile::readAllText((String *)&local_a8,&(dest.ptr)->super_ReadableFile);
  local_20.value.content.ptr = "";
  if (local_a8.size_ != 0) {
    local_20.value.content.ptr = local_a8.ptr;
  }
  local_20.value.content.size_ = (local_a8.size_ - 0x141) + (ulong)(local_a8.size_ == 0);
  local_20.value.content.ptr = local_20.value.content.ptr + 0x141;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_kj::String_&> *)&_kjCondition,&local_20,&bigString);
  Array<char>::~Array(&local_a8);
  if ((local_68 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::StringPtr,kj::String&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1bb,ERROR,
               "\"failed: expected \" \"dest->readAllText().slice(321) == bigString\", _kjCondition"
               ,(char (*) [61])"failed: expected dest->readAllText().slice(321) == bigString",
               (DebugComparison<kj::StringPtr,_kj::String_&> *)&_kjCondition);
  }
  Array<char>::~Array(&bigString.content);
  Own<kj::File,_std::nullptr_t>::dispose(&dest);
  Own<kj::File,_std::nullptr_t>::dispose(&source);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }